

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O3

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _w;
  int _h;
  uint _c;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  Mat local_c8;
  Mat local_78;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar15 = (ulong)_c;
  sVar2 = bottom_blob->elemsize;
  Mat::create(top_blob,_w,_h,_c,sVar2,opt->blob_allocator);
  iVar8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,_c,sVar2,opt->workspace_allocator);
    iVar8 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      uVar11 = _h * _w;
      if (0 < (int)_c) {
        pvVar10 = bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        sVar4 = bottom_blob->elemsize;
        uVar9 = (ulong)uVar11;
        uVar12 = 0;
        do {
          fVar16 = 0.0;
          if (0 < (int)uVar11) {
            uVar14 = 0;
            do {
              fVar16 = fVar16 + *(float *)((long)pvVar10 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar9 != uVar14);
          }
          *(float *)((long)local_78.data + uVar12 * 4) = fVar16;
          uVar12 = uVar12 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
        } while (uVar12 != uVar15);
        if (this->across_channels == 0) {
          if (0 < (int)_c) {
            pvVar10 = bottom_blob->data;
            sVar3 = bottom_blob->cstep;
            pvVar13 = top_blob->data;
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            sVar6 = bottom_blob->elemsize;
            uVar12 = 0;
            do {
              if (0 < (int)uVar11) {
                fVar16 = *(float *)((long)local_78.data + uVar12 * 4);
                uVar14 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar14 * 4) =
                       *(float *)((long)pvVar10 + uVar14 * 4) - fVar16 * (1.0 / (float)(int)uVar11);
                  uVar14 = uVar14 + 1;
                } while (uVar9 != uVar14);
              }
              uVar12 = uVar12 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
              pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar6);
            } while (uVar12 != uVar15);
          }
        }
        else if (0 < (int)_c) {
          fVar16 = 0.0;
          uVar12 = 0;
          do {
            fVar16 = fVar16 + *(float *)((long)local_78.data + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
          if (0 < (int)_c) {
            pvVar10 = bottom_blob->data;
            sVar3 = bottom_blob->cstep;
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar13 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            uVar12 = 0;
            do {
              if (0 < (int)uVar11) {
                uVar14 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar14 * 4) =
                       *(float *)((long)pvVar10 + uVar14 * 4) - fVar16 / (float)(int)(_c * uVar11);
                  uVar14 = uVar14 + 1;
                } while (uVar9 != uVar14);
              }
              uVar12 = uVar12 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
              pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar6);
            } while (uVar12 != uVar15);
          }
        }
      }
      iVar8 = 0;
      if (this->normalize_variance != 0) {
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8._20_8_ = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        Mat::create(&local_c8,_c,sVar2,opt->workspace_allocator);
        if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0)) {
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_c8.allocator + 0x18))();
              }
            }
          }
          iVar8 = -100;
        }
        else {
          if (0 < (int)_c) {
            pvVar10 = top_blob->data;
            sVar2 = top_blob->cstep;
            sVar3 = top_blob->elemsize;
            uVar9 = (ulong)uVar11;
            uVar12 = 0;
            do {
              fVar16 = 0.0;
              if (0 < (int)uVar11) {
                uVar14 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar10 + uVar14 * 4);
                  fVar16 = fVar16 + fVar1 * fVar1;
                  uVar14 = uVar14 + 1;
                } while (uVar9 != uVar14);
              }
              *(float *)((long)local_c8.data + uVar12 * 4) = fVar16;
              uVar12 = uVar12 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
            } while (uVar12 != uVar15);
            if (this->across_channels == 0) {
              if (0 < (int)_c) {
                pvVar10 = top_blob->data;
                sVar2 = top_blob->cstep;
                sVar3 = top_blob->elemsize;
                uVar12 = 0;
                do {
                  if (0 < (int)uVar11) {
                    fVar16 = *(float *)((long)local_c8.data + uVar12 * 4);
                    fVar1 = this->eps;
                    uVar14 = 0;
                    do {
                      *(float *)((long)pvVar10 + uVar14 * 4) =
                           *(float *)((long)pvVar10 + uVar14 * 4) *
                           (1.0 / (SQRT(fVar16 * (1.0 / (float)(int)uVar11)) + fVar1));
                      uVar14 = uVar14 + 1;
                    } while (uVar9 != uVar14);
                  }
                  uVar12 = uVar12 + 1;
                  pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                } while (uVar12 != uVar15);
              }
            }
            else if (0 < (int)_c) {
              fVar16 = 0.0;
              uVar12 = 0;
              do {
                fVar16 = fVar16 + *(float *)((long)local_c8.data + uVar12 * 4);
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
              if (0 < (int)_c) {
                fVar1 = this->eps;
                sVar2 = top_blob->cstep;
                sVar3 = top_blob->elemsize;
                pvVar10 = top_blob->data;
                uVar12 = 0;
                do {
                  if (0 < (int)uVar11) {
                    uVar14 = 0;
                    do {
                      *(float *)((long)pvVar10 + uVar14 * 4) =
                           *(float *)((long)pvVar10 + uVar14 * 4) *
                           (1.0 / (SQRT(fVar16 / (float)(int)(_c * uVar11)) + fVar1));
                      uVar14 = uVar14 + 1;
                    } while (uVar9 != uVar14);
                  }
                  uVar12 = uVar12 + 1;
                  pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
                } while (uVar12 != uVar15);
              }
            }
          }
          piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          iVar8 = 0;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                  iVar8 = 0;
                }
              }
              else {
                (**(code **)(*(long *)local_c8.allocator + 0x18))();
                iVar8 = 0;
              }
            }
          }
        }
      }
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (**(code **)(*(long *)local_78.allocator + 0x18))();
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i = 0; i < size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q = 0; q < channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i = 0; i < size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q = 0; q < channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrtf(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
    }

    return 0;
}